

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

void __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::GenericDocument(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  *this,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator,size_t stackCapacity
                 ,CrtAllocator *stackAllocator)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar1;
  undefined1 auVar2 [32];
  
  (this->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.n = (Number)0x0;
  (this->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.s.str = (Ch *)0x0;
  this->allocator_ = allocator;
  this->ownAllocator_ = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  (this->stack_).allocator_ = stackAllocator;
  auVar2 = ZEXT432(0) << 0x40;
  (this->stack_).ownAllocator_ = (CrtAllocator *)auVar2._0_8_;
  (this->stack_).stack_ = (char *)auVar2._8_8_;
  (this->stack_).stackTop_ = (char *)auVar2._16_8_;
  (this->stack_).stackEnd_ = (char *)auVar2._24_8_;
  (this->stack_).initialCapacity_ = stackCapacity;
  (this->parseResult_).code_ = kParseErrorNone;
  (this->parseResult_).offset_ = 0;
  if (allocator == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
    pMVar1 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)operator_new(0x28);
    pMVar1->chunkHead_ = (ChunkHeader *)0x0;
    pMVar1->chunk_capacity_ = 0x10000;
    pMVar1->ownBaseAllocator_ = (CrtAllocator *)0x0;
    pMVar1->userBuffer_ = (void *)0x0;
    pMVar1->baseAllocator_ = (CrtAllocator *)0x0;
    this->allocator_ = pMVar1;
    this->ownAllocator_ = pMVar1;
  }
  return;
}

Assistant:

GenericValue() RAPIDJSON_NOEXCEPT : data_() { data_.f.flags = kNullFlag; }